

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::ShaderSubroutine::Utils::getShaderStageString_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,_shader_stage *shader_stage)

{
  TestError *this_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"?","");
  if ((ulong)*(uint *)this < 5) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)(&DAT_01a60414 + *(int *)(&DAT_01a60414 + (ulong)*(uint *)this * 4)));
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized shader stage",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x4ea);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string Utils::getShaderStageString(const _shader_stage& shader_stage)
{
	std::string result = "?";

	switch (shader_stage)
	{
	case SHADER_STAGE_FRAGMENT:
		result = "Fragment Shader";
		break;
	case SHADER_STAGE_GEOMETRY:
		result = "Geometry Shader";
		break;
	case SHADER_STAGE_TESSELLATION_CONTROL:
		result = "Tessellation Control Shader";
		break;
	case SHADER_STAGE_TESSELLATION_EVALUATION:
		result = "Tessellation Evaluation Shader";
		break;
	case SHADER_STAGE_VERTEX:
		result = "Vertex Shader";
		break;

	default:
	{
		TCU_FAIL("Unrecognized shader stage");
	}
	} /* switch (shader_stage) */

	return result;
}